

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

LY_ERR lys_parse(ly_ctx *ctx,ly_in *in,LYS_INFORMAT format,char **features,lys_module **module)

{
  lys_module *local_48;
  lys_module *mod;
  lys_module **pplStack_38;
  LY_ERR ret;
  lys_module **module_local;
  char **features_local;
  ly_in *plStack_20;
  LYS_INFORMAT format_local;
  ly_in *in_local;
  ly_ctx *ctx_local;
  
  mod._4_4_ = 0;
  if (module != (lys_module **)0x0) {
    *module = (lys_module *)0x0;
  }
  pplStack_38 = module;
  module_local = (lys_module **)features;
  features_local._4_4_ = format;
  plStack_20 = in;
  in_local = (ly_in *)ctx;
  if (ctx == (ly_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx","lys_parse");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else if (in == (ly_in *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","in","lys_parse");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else {
    features_local._4_4_ = lys_parse_get_format(in,format);
    if (features_local._4_4_ == LYS_IN_UNKNOWN) {
      ly_log((ly_ctx *)in_local,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","format",
             "lys_parse");
      ctx_local._4_4_ = LY_EINVAL;
    }
    else {
      plStack_20->func_start = plStack_20->current;
      mod._4_4_ = lys_parse_in((ly_ctx *)in_local,plStack_20,features_local._4_4_,
                               (_func_LY_ERR_ly_ctx_ptr_lysp_module_ptr_lysp_submodule_ptr_void_ptr
                                *)0x0,(void *)0x0,(ly_set *)(in_local + 2),&local_48);
      if ((((mod._4_4_ == LY_SUCCESS) &&
           (mod._4_4_ = _lys_set_implemented
                                  (local_48,(char **)module_local,
                                   (lys_glob_unres *)&in_local[1].length), mod._4_4_ == LY_SUCCESS))
          && ((in_local[4].type & 0x800000) == LY_IN_FD)) &&
         ((mod._4_4_ = lys_unres_dep_sets_create
                                 ((ly_ctx *)in_local,(ly_set *)&in_local[1].length,local_48),
          mod._4_4_ == LY_SUCCESS &&
          (mod._4_4_ = lys_compile_depset_all
                                 ((ly_ctx *)in_local,(lys_glob_unres *)&in_local[1].length),
          mod._4_4_ == LY_SUCCESS)))) {
        lys_unres_glob_erase((lys_glob_unres *)&in_local[1].length);
      }
      if (mod._4_4_ == LY_SUCCESS) {
        if (pplStack_38 != (lys_module **)0x0) {
          *pplStack_38 = local_48;
        }
      }
      else {
        lys_unres_glob_revert((ly_ctx *)in_local,(lys_glob_unres *)&in_local[1].length);
        lys_unres_glob_erase((lys_glob_unres *)&in_local[1].length);
      }
      ctx_local._4_4_ = mod._4_4_;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_parse(struct ly_ctx *ctx, struct ly_in *in, LYS_INFORMAT format, const char **features, struct lys_module **module)
{
    LY_ERR ret = LY_SUCCESS;
    struct lys_module *mod;

    if (module) {
        *module = NULL;
    }
    LY_CHECK_ARG_RET(NULL, ctx, in, LY_EINVAL);

    format = lys_parse_get_format(in, format);
    LY_CHECK_ARG_RET(ctx, format, LY_EINVAL);

    /* remember input position */
    in->func_start = in->current;

    /* parse */
    ret = lys_parse_in(ctx, in, format, NULL, NULL, &ctx->unres.creating, &mod);
    LY_CHECK_GOTO(ret, cleanup);

    /* implement */
    ret = _lys_set_implemented(mod, features, &ctx->unres);
    LY_CHECK_GOTO(ret, cleanup);

    if (!(ctx->flags & LY_CTX_EXPLICIT_COMPILE)) {
        /* create dep set for the module and mark all the modules that will be (re)compiled */
        LY_CHECK_GOTO(ret = lys_unres_dep_sets_create(ctx, &ctx->unres.dep_sets, mod), cleanup);

        /* (re)compile the whole dep set (other dep sets will have no modules marked for compilation) */
        LY_CHECK_GOTO(ret = lys_compile_depset_all(ctx, &ctx->unres), cleanup);

        /* unres resolved */
        lys_unres_glob_erase(&ctx->unres);
    }

cleanup:
    if (ret) {
        lys_unres_glob_revert(ctx, &ctx->unres);
        lys_unres_glob_erase(&ctx->unres);
    } else if (module) {
        *module = mod;
    }
    return ret;
}